

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int fits_execute_template(fitsfile *ff,char *ngp_template,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  char *in_RSI;
  fitsfile *in_RDI;
  long luv;
  char used_name [80];
  char grnm [80];
  int used_ver;
  int more_keys;
  int keys_exist;
  int tmp0;
  int my_hn;
  int i;
  int first_extension;
  int exit_flg;
  int r;
  char *in_stack_00002658;
  int *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int local_3c;
  int local_34;
  int local_30;
  undefined4 local_2c;
  undefined4 local_28;
  int local_24;
  int *local_20;
  char *local_18;
  fitsfile *local_10;
  int local_4;
  
  if (in_RDX == (int *)0x0) {
    local_4 = 0x16a;
  }
  else if (*in_RDX == 0) {
    if ((in_RDI == (fitsfile *)0x0) || (in_RSI == (char *)0x0)) {
      *in_RDX = 0x16a;
      local_4 = *in_RDX;
    }
    else {
      ngp_inclevel = 0;
      ngp_grplevel = 0;
      master_grp_idx = 1;
      local_28 = 0;
      ngp_master_dir[0] = '\0';
      local_2c = 1;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_24 = ngp_delete_extver_tab();
      if (local_24 == 0) {
        ffghdn(local_10,&local_34);
        if (local_34 < 2) {
          ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
          ffghsp(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (int *)0x1d7e08);
          ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
          if (*local_20 != 0) {
            return *local_20;
          }
          if (0 < local_3c) {
            local_2c = 0;
          }
        }
        else {
          local_2c = 0;
          for (local_30 = 2; local_30 <= local_34; local_30 = local_30 + 1) {
            *local_20 = 0;
            ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
            if (*local_20 != 0) break;
            ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                  in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
            if (*local_20 == 0) {
              ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
              if (*local_20 == 0xcc) {
                *local_20 = 0;
              }
              if (*local_20 == 0) {
                iVar1 = ngp_set_extver(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
                *local_20 = iVar1;
              }
            }
          }
          ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
        }
        if (*local_20 == 0) {
          iVar1 = ngp_include_file(in_stack_00002658);
          *local_20 = iVar1;
          if (iVar1 == 0) {
            sVar2 = strlen(local_18);
            local_30 = (int)sVar2;
            do {
              iVar1 = local_30;
              local_30 = iVar1 + -1;
              if (local_30 < 0) break;
            } while (local_18[local_30] != '/');
            local_30 = iVar1;
            if (999 < iVar1) {
              local_30 = 999;
            }
            if (0 < local_30) {
              memcpy(ngp_master_dir,local_18,(long)local_30);
              ngp_master_dir[local_30] = '\0';
            }
            local_24 = ngp_read_line(in_stack_ffffffffffffff20);
            if (local_24 == 0) {
              if (ngp_keyidx - 1U < 4 || ngp_keyidx == 5) {
                iVar1 = (*(code *)(&DAT_00273f40 +
                                  *(int *)(&DAT_00273f40 + (ulong)(ngp_keyidx - 1U) * 4)))();
                return iVar1;
              }
              local_24 = 0x171;
            }
            ngp_free_line();
            ngp_free_prevline();
            ngp_delete_extver_tab();
            *local_20 = local_24;
            local_4 = local_24;
          }
          else {
            local_4 = *local_20;
          }
        }
        else {
          local_4 = *local_20;
        }
      }
      else {
        *local_20 = local_24;
        local_4 = local_24;
      }
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int	fits_execute_template(fitsfile *ff, char *ngp_template, int *status)
 { int		r, exit_flg, first_extension, i, my_hn, tmp0, keys_exist, more_keys, used_ver;
   char		grnm[NGP_MAX_STRING], used_name[NGP_MAX_STRING];
   long		luv;

   if (NULL == status) return(NGP_NUL_PTR);
   if (NGP_OK != *status) return(*status);

   /* This function uses many global variables (local to this file) and
      therefore is not thread-safe. */
   FFLOCK;
   
   if ((NULL == ff) || (NULL == ngp_template))
     { *status = NGP_NUL_PTR;
       FFUNLOCK;
       return(*status);
     }

   ngp_inclevel = 0;				/* initialize things, not all should be zero */
   ngp_grplevel = 0;
   master_grp_idx = 1;
   exit_flg = 0;
   ngp_master_dir[0] = 0;			/* this should be before 1st call to ngp_include_file */
   first_extension = 1;				/* we need to create PHDU */

   if (NGP_OK != (r = ngp_delete_extver_tab()))
     { *status = r;
       FFUNLOCK;
       return(r);
     }

   fits_get_hdu_num(ff, &my_hn);		/* our HDU position */
   if (my_hn <= 1)				/* check whether we really need to create PHDU */
     { fits_movabs_hdu(ff, 1, &tmp0, status);
       fits_get_hdrspace(ff, &keys_exist, &more_keys, status);
       fits_movabs_hdu(ff, my_hn, &tmp0, status);
       if (NGP_OK != *status) /* error here means file is corrupted */
       {
          FFUNLOCK;
          return(*status);	
       }
       if (keys_exist > 0) first_extension = 0;	/* if keywords exist assume PHDU already exist */
     }
   else
     { first_extension = 0;			/* PHDU (followed by 1+ extensions) exist */

       for (i = 2; i<= my_hn; i++)
        { *status = NGP_OK;
          fits_movabs_hdu(ff, 1, &tmp0, status);
          if (NGP_OK != *status) break;

          fits_read_key(ff, TSTRING, "EXTNAME", used_name, NULL, status);
          if (NGP_OK != *status)  continue;

          fits_read_key(ff, TLONG, "EXTVER", &luv, NULL, status);
          used_ver = luv;			/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
          if (VALUE_UNDEFINED == *status)
            { used_ver = 1;
              *status = NGP_OK;
            }

          if (NGP_OK == *status) *status = ngp_set_extver(used_name, used_ver);
        }

       fits_movabs_hdu(ff, my_hn, &tmp0, status);
     }
     
   if (NGP_OK != *status) {
      FFUNLOCK;
      return(*status);
   }                                                                       
   if (NGP_OK != (*status = ngp_include_file(ngp_template))) {
      FFUNLOCK;
      return(*status);
   }
   
   for (i = strlen(ngp_template) - 1; i >= 0; i--) /* strlen is > 0, otherwise fopen failed */
    { 
#ifdef MSDOS
      if ('\\' == ngp_template[i]) break;
#else
      if ('/' == ngp_template[i]) break;
#endif
    } 
      
   i++;
   if (i > (NGP_MAX_FNAME - 1)) i = NGP_MAX_FNAME - 1;

   if (i > 0)
     { memcpy(ngp_master_dir, ngp_template, i);
       ngp_master_dir[i] = 0;
     }


   for (;;)
    { if (NGP_OK != (r = ngp_read_line(1))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
         case NGP_TOKEN_SIMPLE:
			if (0 == first_extension)	/* simple only allowed in first HDU */
			  { r = NGP_TOKEN_NOT_EXPECT;
			    break;
			  }
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, NGP_XTENSION_SIMPLE | NGP_XTENSION_FIRST);
			first_extension = 0;
			break;

         case NGP_TOKEN_XTENSION:
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, (first_extension ? NGP_XTENSION_FIRST : 0));
			first_extension = 0;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING); }
			else
			  { snprintf(grnm,NGP_MAX_STRING, "DEFAULT_GROUP_%d", master_grp_idx++); }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, 0);
			first_extension = 0;
			break;

	 case NGP_TOKEN_EOF:
			exit_flg = 1;
			break;

         default:	r = NGP_TOKEN_NOT_EXPECT;
			break;
       }
      if (exit_flg || (NGP_OK != r)) break;
    }

/* all top level HDUs up to faulty one are left intact in case of i/o error. It is up
   to the caller to call fits_close_file or fits_delete_file when this function returns
   error. */

   ngp_free_line();		/* deallocate last line (if any) */
   ngp_free_prevline();		/* deallocate cached line (if any) */
   ngp_delete_extver_tab();	/* delete extver table (if present), error ignored */
   
   *status = r;
   FFUNLOCK;
   return(r);
 }